

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Truncate(sqlite3_pcache *p,uint iLimit)

{
  PCache1 *pCache;
  uint iLimit_local;
  sqlite3_pcache *p_local;
  
  sqlite3_mutex_enter((sqlite3_mutex *)**(undefined8 **)p);
  if (iLimit <= *(uint *)(p + 0x20)) {
    pcache1TruncateUnsafe((PCache1 *)p,iLimit);
    *(uint *)(p + 0x20) = iLimit - 1;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)**(undefined8 **)p);
  return;
}

Assistant:

static void pcache1Truncate(sqlite3_pcache *p, unsigned int iLimit){
  PCache1 *pCache = (PCache1 *)p;
  pcache1EnterMutex(pCache->pGroup);
  if( iLimit<=pCache->iMaxKey ){
    pcache1TruncateUnsafe(pCache, iLimit);
    pCache->iMaxKey = iLimit-1;
  }
  pcache1LeaveMutex(pCache->pGroup);
}